

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_begin(AMQP_VALUE value,BEGIN_HANDLE *begin_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  BEGIN_HANDLE pBVar3;
  AMQP_VALUE pAVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  uint16_t remote_channel;
  AMQP_VALUE offered_capabilities_array;
  
  pBVar3 = (BEGIN_HANDLE)malloc(8);
  if (pBVar3 == (BEGIN_HANDLE)0x0) {
    *begin_handle = (BEGIN_HANDLE)0x0;
    return 0x91b;
  }
  pBVar3->composite_value = (AMQP_VALUE)0x0;
  *begin_handle = pBVar3;
  pAVar4 = amqpvalue_get_inplace_described_value(value);
  if (pAVar4 == (AMQP_VALUE)0x0) {
    begin_destroy(*begin_handle);
    return 0x923;
  }
  iVar1 = amqpvalue_get_list_item_count(pAVar4,&list_item_count);
  if (iVar1 != 0) {
    return 0x92a;
  }
  if (list_item_count == 0) {
    return 0x974;
  }
  pAVar5 = amqpvalue_get_list_item(pAVar4,0);
  if (pAVar5 != (AMQP_VALUE)0x0) {
    AVar2 = amqpvalue_get_type(pAVar5);
    if ((AVar2 != AMQP_TYPE_NULL) &&
       (iVar1 = amqpvalue_get_ushort(pAVar5,&remote_channel), iVar1 != 0)) {
      amqpvalue_destroy(pAVar5);
      begin_destroy(*begin_handle);
      return 0x946;
    }
    amqpvalue_destroy(pAVar5);
  }
  if (list_item_count < 2) {
    return 0x974;
  }
  pAVar5 = amqpvalue_get_list_item(pAVar4,1);
  if (pAVar5 == (AMQP_VALUE)0x0) {
    begin_destroy(*begin_handle);
    return 0x956;
  }
  AVar2 = amqpvalue_get_type(pAVar5);
  if (AVar2 == AMQP_TYPE_NULL) {
    amqpvalue_destroy(pAVar5);
    begin_destroy(*begin_handle);
    return 0x960;
  }
  iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&remote_channel);
  if (iVar1 != 0) {
    amqpvalue_destroy(pAVar5);
    begin_destroy(*begin_handle);
    return 0x96a;
  }
  amqpvalue_destroy(pAVar5);
  if (list_item_count < 3) {
    return 0x99d;
  }
  pAVar5 = amqpvalue_get_list_item(pAVar4,2);
  if (pAVar5 != (AMQP_VALUE)0x0) {
    AVar2 = amqpvalue_get_type(pAVar5);
    if (AVar2 == AMQP_TYPE_NULL) {
      amqpvalue_destroy(pAVar5);
      begin_destroy(*begin_handle);
      return 0x989;
    }
    iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&remote_channel);
    if (iVar1 != 0) {
      amqpvalue_destroy(pAVar5);
      begin_destroy(*begin_handle);
      return 0x993;
    }
    amqpvalue_destroy(pAVar5);
    if (list_item_count < 4) {
      return 0x9c6;
    }
    pAVar5 = amqpvalue_get_list_item(pAVar4,3);
    if (pAVar5 != (AMQP_VALUE)0x0) {
      AVar2 = amqpvalue_get_type(pAVar5);
      if (AVar2 == AMQP_TYPE_NULL) {
        amqpvalue_destroy(pAVar5);
        begin_destroy(*begin_handle);
        return 0x9b2;
      }
      iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&remote_channel);
      if (iVar1 == 0) {
        amqpvalue_destroy(pAVar5);
        if (4 < list_item_count) {
          pAVar5 = amqpvalue_get_list_item(pAVar4,4);
          if (pAVar5 != (AMQP_VALUE)0x0) {
            AVar2 = amqpvalue_get_type(pAVar5);
            if ((AVar2 != AMQP_TYPE_NULL) &&
               (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&remote_channel), iVar1 != 0)) {
              amqpvalue_destroy(pAVar5);
              begin_destroy(*begin_handle);
              return 0x9de;
            }
            amqpvalue_destroy(pAVar5);
          }
          if (5 < list_item_count) {
            pAVar5 = amqpvalue_get_list_item(pAVar4,5);
            if (pAVar5 != (AMQP_VALUE)0x0) {
              AVar2 = amqpvalue_get_type(pAVar5);
              if (AVar2 != AMQP_TYPE_NULL) {
                _remote_channel = (AMQP_VALUE)0x0;
                AVar2 = amqpvalue_get_type(pAVar5);
                if (((AVar2 != AMQP_TYPE_ARRAY) ||
                    (iVar1 = amqpvalue_get_array(pAVar5,&offered_capabilities_array), iVar1 != 0))
                   && (iVar1 = amqpvalue_get_symbol(pAVar5,(char **)&remote_channel), iVar1 != 0)) {
                  amqpvalue_destroy(pAVar5);
                  begin_destroy(*begin_handle);
                  return 0x9fd;
                }
              }
              amqpvalue_destroy(pAVar5);
            }
            if (6 < list_item_count) {
              pAVar5 = amqpvalue_get_list_item(pAVar4,6);
              if (pAVar5 != (AMQP_VALUE)0x0) {
                AVar2 = amqpvalue_get_type(pAVar5);
                if (AVar2 != AMQP_TYPE_NULL) {
                  _remote_channel = (AMQP_VALUE)0x0;
                  AVar2 = amqpvalue_get_type(pAVar5);
                  if (((AVar2 != AMQP_TYPE_ARRAY) ||
                      (iVar1 = amqpvalue_get_array(pAVar5,&offered_capabilities_array), iVar1 != 0))
                     && (iVar1 = amqpvalue_get_symbol(pAVar5,(char **)&remote_channel), iVar1 != 0))
                  {
                    amqpvalue_destroy(pAVar5);
                    begin_destroy(*begin_handle);
                    return 0xa1c;
                  }
                }
                amqpvalue_destroy(pAVar5);
              }
              if ((7 < list_item_count) &&
                 (pAVar4 = amqpvalue_get_list_item(pAVar4,7), pAVar4 != (AMQP_VALUE)0x0)) {
                AVar2 = amqpvalue_get_type(pAVar4);
                if ((AVar2 != AMQP_TYPE_NULL) &&
                   (iVar1 = amqpvalue_get_map(pAVar4,(AMQP_VALUE *)&remote_channel), iVar1 != 0)) {
                  amqpvalue_destroy(pAVar4);
                  begin_destroy(*begin_handle);
                  return 0xa39;
                }
                amqpvalue_destroy(pAVar4);
              }
            }
          }
        }
        pAVar4 = amqpvalue_clone(value);
        pBVar3->composite_value = pAVar4;
        return 0;
      }
      amqpvalue_destroy(pAVar5);
      begin_destroy(*begin_handle);
      return 0x9bc;
    }
    begin_destroy(*begin_handle);
    return 0x9a8;
  }
  begin_destroy(*begin_handle);
  return 0x97f;
}

Assistant:

int amqpvalue_get_begin(AMQP_VALUE value, BEGIN_HANDLE* begin_handle)
{
    int result;
    BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin_create_internal();
    *begin_handle = begin_instance;
    if (*begin_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            begin_destroy(*begin_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* remote-channel */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint16_t remote_channel;
                                if (amqpvalue_get_ushort(item_value, &remote_channel) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* next-outgoing-id */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                transfer_number next_outgoing_id;
                                if (amqpvalue_get_transfer_number(item_value, &next_outgoing_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* incoming-window */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t incoming_window;
                                if (amqpvalue_get_uint(item_value, &incoming_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* outgoing-window */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t outgoing_window;
                                if (amqpvalue_get_uint(item_value, &outgoing_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle-max */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                handle handle_max;
                                if (amqpvalue_get_handle(item_value, &handle_max) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    begin_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}